

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

t_float fielddesc_cvtfromcoord(_fielddesc *f,t_float coord)

{
  float local_28;
  float local_24;
  t_float extreme;
  t_float div;
  t_float val;
  t_float coord_local;
  _fielddesc *f_local;
  
  if ((f->fd_screen2 != f->fd_screen1) ||
     (extreme = coord, NAN(f->fd_screen2) || NAN(f->fd_screen1))) {
    extreme = (coord - f->fd_screen1) * ((f->fd_v2 - f->fd_v1) / (f->fd_screen2 - f->fd_screen1)) +
              f->fd_v1;
    if ((f->fd_quantum != 0.0) || (NAN(f->fd_quantum))) {
      extreme = (float)(int)(extreme / f->fd_quantum + 0.5) * f->fd_quantum;
    }
    if (f->fd_v2 <= f->fd_v1) {
      local_24 = f->fd_v2;
    }
    else {
      local_24 = f->fd_v1;
    }
    if (extreme < local_24) {
      extreme = local_24;
    }
    if (f->fd_v1 < f->fd_v2 || f->fd_v1 == f->fd_v2) {
      local_28 = f->fd_v2;
    }
    else {
      local_28 = f->fd_v1;
    }
    if (local_28 < extreme) {
      extreme = local_28;
    }
  }
  return extreme;
}

Assistant:

t_float fielddesc_cvtfromcoord(t_fielddesc *f, t_float coord)
{
    t_float val;
    if (f->fd_screen2 == f->fd_screen1)
        val = coord;
    else
    {
        t_float div = (f->fd_v2 - f->fd_v1)/(f->fd_screen2 - f->fd_screen1);
        t_float extreme;
        val = f->fd_v1 + (coord - f->fd_screen1) * div;
        if (f->fd_quantum != 0)
            val = ((int)((val/f->fd_quantum) + 0.5)) *  f->fd_quantum;
        extreme = (f->fd_v1 < f->fd_v2 ?
            f->fd_v1 : f->fd_v2);
        if (val < extreme) val = extreme;
        extreme = (f->fd_v1 > f->fd_v2 ?
            f->fd_v1 : f->fd_v2);
        if (val > extreme) val = extreme;
    }
    return (val);
 }